

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void predict(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *args)

{
  bool bVar1;
  byte bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  predictions;
  istream *in;
  bool inputIsStdIn;
  string infile;
  ifstream ifs;
  FastText fasttext;
  bool printProb;
  real threshold;
  int32_t k;
  size_t *in_stack_fffffffffffffc98;
  undefined6 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca6;
  undefined1 in_stack_fffffffffffffca7;
  byte in_stack_fffffffffffffcbe;
  undefined1 printProb_00;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffcc0;
  string local_318 [8];
  FastText *in_stack_fffffffffffffcf0;
  string local_2f8 [136];
  real in_stack_fffffffffffffd90;
  int32_t in_stack_fffffffffffffd94;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd98;
  istream *in_stack_fffffffffffffda0;
  FastText *in_stack_fffffffffffffda8;
  string local_e0 [8];
  string *in_stack_ffffffffffffff28;
  FastText *in_stack_ffffffffffffff30;
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if ((sVar3 < 4) ||
     (sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI), 6 < sVar3)) {
    printPredictUsage();
    exit(1);
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (4 < sVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,4);
    std::__cxx11::stoi((string *)
                       CONCAT17(in_stack_fffffffffffffca7,
                                CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),
                       in_stack_fffffffffffffc98,0);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar3 == 6) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,5);
      std::__cxx11::stof((string *)
                         CONCAT17(in_stack_fffffffffffffca7,
                                  CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),
                         in_stack_fffffffffffffc98);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDI,1);
  std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffca7,
                           CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),
                  (char *)in_stack_fffffffffffffc98);
  ::fasttext::FastText::FastText(in_stack_fffffffffffffcf0);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,2);
  std::__cxx11::string::string(local_e0,(string *)pvVar4);
  ::fasttext::FastText::loadModel(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_e0);
  std::ifstream::ifstream(local_2f8);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,3);
  std::__cxx11::string::string(local_318,(string *)pvVar4);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffca7,
                                   CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),
                          (char *)in_stack_fffffffffffffc98);
  printProb_00 = bVar1;
  if (((!bVar1) && (std::ifstream::open(local_2f8,(_Ios_Openmode)local_318), !bVar1)) &&
     (in_stack_fffffffffffffcbe = std::ifstream::is_open(), (in_stack_fffffffffffffcbe & 1) == 0)) {
    this = std::operator<<((ostream *)&std::cerr,"Input file cannot be opened!");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x148db9);
  while (bVar1 = ::fasttext::FastText::predictLine
                           (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                            in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                            in_stack_fffffffffffffd90), bVar1) {
    printPredictions(in_stack_fffffffffffffcc0,(bool)printProb_00,(bool)in_stack_fffffffffffffcbe);
  }
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) != 0) {
    std::ifstream::close();
  }
  exit(0);
}

Assistant:

void predict(const std::vector<std::string>& args) {
  if (args.size() < 4 || args.size() > 6) {
    printPredictUsage();
    exit(EXIT_FAILURE);
  }
  int32_t k = 1;
  real threshold = 0.0;
  if (args.size() > 4) {
    k = std::stoi(args[4]);
    if (args.size() == 6) {
      threshold = std::stof(args[5]);
    }
  }

  bool printProb = args[1] == "predict-prob";
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));

  std::ifstream ifs;
  std::string infile(args[3]);
  bool inputIsStdIn = infile == "-";
  if (!inputIsStdIn) {
    ifs.open(infile);
    if (!inputIsStdIn && !ifs.is_open()) {
      std::cerr << "Input file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
  }
  std::istream& in = inputIsStdIn ? std::cin : ifs;
  std::vector<std::pair<real, std::string>> predictions;
  while (fasttext.predictLine(in, predictions, k, threshold)) {
    printPredictions(predictions, printProb, false);
  }
  if (ifs.is_open()) {
    ifs.close();
  }

  exit(0);
}